

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void trigger_nrx4_envelope(Emulator *e,Envelope *envelope,Address addr)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *func_name;
  
  envelope->volume = envelope->initial_volume;
  uVar1._0_1_ = envelope->period;
  uVar1._1_1_ = envelope->volume;
  uVar1._2_2_ = *(undefined2 *)&envelope->field_0xa;
  uVar2 = 8;
  if ((undefined1)uVar1 != '\0') {
    uVar2 = uVar1;
  }
  envelope->timer = uVar2 & 0xff;
  envelope->automatic = TRUE;
  if ((e->state).apu.frame == '\x06') {
    envelope->timer = (uVar2 & 0xff) + 1;
  }
  func_name = "unknown";
  if (addr < 0x17) {
    func_name = *(char **)(get_apu_reg_string_s_strings + (ulong)addr * 8);
  }
  pcVar3 = "unknown";
  if (func_name != (char *)0x0) {
    pcVar3 = func_name;
  }
  HOOK_trigger_nrx4_info_asii(e,func_name,(ulong)addr,pcVar3);
  return;
}

Assistant:

static void trigger_nrx4_envelope(Emulator* e, Envelope* envelope,
                                  Address addr) {
  envelope->volume = envelope->initial_volume;
  envelope->timer = envelope->period ? envelope->period : ENVELOPE_MAX_PERIOD;
  envelope->automatic = TRUE;
  /* If the next APU frame will update the envelope, increment the timer. */
  if (UNLIKELY(APU.frame + 1 == FRAME_SEQUENCER_UPDATE_ENVELOPE_FRAME)) {
    envelope->timer++;
  }
  HOOK(trigger_nrx4_info_asii, addr, get_apu_reg_string(addr), envelope->volume,
       envelope->timer);
}